

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_6::JsonSchemaCodeGenerator::~JsonSchemaCodeGenerator
          (JsonSchemaCodeGenerator *this)

{
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateJsonSchema(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }